

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<kj::StringPtr&,char_const(&)[3],kj::StringPtr&,char_const(&)[7],kj::StringPtr&,char_const(&)[31]>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [3],
          StringPtr *params_2,char (*params_3) [7],StringPtr *params_4,char (*params_5) [31])

{
  StringPtr *pSVar1;
  char (*value) [3];
  char (*value_00) [7];
  char (*value_01) [31];
  ArrayPtr<const_char> *in_stack_ffffffffffffff50;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  StringPtr *local_38;
  StringPtr *params_local_4;
  char (*params_local_3) [7];
  StringPtr *params_local_2;
  char (*params_local_1) [3];
  StringPtr *params_local;
  
  local_38 = (StringPtr *)params_3;
  params_local_4 = params_2;
  params_local_3 = (char (*) [7])params_1;
  params_local_2 = params;
  params_local_1 = (char (*) [3])this;
  params_local = (StringPtr *)__return_storage_ptr__;
  pSVar1 = fwd<kj::StringPtr&>((StringPtr *)this);
  local_48 = toCharSequence<kj::StringPtr&>(pSVar1);
  value = ::const((char (*) [3])params_local_2);
  local_58 = toCharSequence<char_const(&)[3]>(value);
  pSVar1 = fwd<kj::StringPtr&>((StringPtr *)params_local_3);
  local_68 = toCharSequence<kj::StringPtr&>(pSVar1);
  value_00 = ::const((char (*) [7])params_local_4);
  local_78 = toCharSequence<char_const(&)[7]>(value_00);
  pSVar1 = fwd<kj::StringPtr&>(local_38);
  local_88 = toCharSequence<kj::StringPtr&>(pSVar1);
  value_01 = ::const((char (*) [31])params_4);
  local_98 = toCharSequence<char_const(&)[31]>(value_01);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_48,&local_58,&local_68,&local_78,&local_88,&local_98
             ,in_stack_ffffffffffffff50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}